

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::ClientImpl::handle_request
          (ClientImpl *this,Stream *strm,Request *req,Response *res,bool close_connection,
          Error *error)

{
  string *psVar1;
  undefined8 cnonce_count;
  bool bVar2;
  char cVar3;
  int iVar4;
  ssize_t sVar5;
  size_t length;
  char *__s;
  bool *cnonce;
  string *password;
  undefined1 local_610 [8];
  Request req_save;
  Request req2;
  Response new_res;
  undefined1 local_78 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  auth;
  
  if ((req->path)._M_string_length != 0) {
    Request::Request((Request *)local_610,req);
    iVar4 = (*this->_vptr_ClientImpl[6])(this);
    if ((((char)iVar4 == '\0') && ((this->proxy_host_)._M_string_length != 0)) &&
       (this->proxy_port_ != -1)) {
      Request::Request((Request *)&req_save.authorization_count_,req);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     "http://",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &this->host_and_port_);
      auth._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&req->path;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &req2.authorization_count_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auth._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::operator=
                ((string *)(req2.method.field_2._M_local_buf + 8),
                 (string *)&req2.authorization_count_);
      std::__cxx11::string::~string((string *)&req2.authorization_count_);
      std::__cxx11::string::~string((string *)local_78);
      bVar2 = process_request(this,strm,(Request *)&req_save.authorization_count_,res,
                              close_connection,error);
      Request::operator=(req,(Request *)&req_save.authorization_count_);
      std::__cxx11::string::_M_assign
                ((string *)auth._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Request::~Request((Request *)&req_save.authorization_count_);
    }
    else {
      bVar2 = process_request(this,strm,req,res,close_connection,error);
    }
    if (bVar2) {
      iVar4 = res->status;
      cVar3 = true;
      if ((iVar4 - 0x12dU < 99) && (this->follow_location_ == true)) {
        Request::operator=(req,(Request *)local_610);
        cVar3 = redirect(this,req,res,error);
        iVar4 = res->status;
      }
      if (((iVar4 == 0x197) || (iVar4 == 0x191)) && (req->authorization_count_ < 5)) {
        psVar1 = &this->proxy_digest_auth_username_;
        password = &this->proxy_digest_auth_password_;
        if (iVar4 != 0x197) {
          password = &this->digest_auth_password_;
          psVar1 = &this->digest_auth_username_;
        }
        if ((psVar1->_M_string_length != 0) && (password->_M_string_length != 0)) {
          auth._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&auth;
          auth._M_t._M_impl._0_4_ = 0;
          auth._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          auth._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          auth._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
          auth._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               auth._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          auth._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)psVar1;
          bVar2 = detail::parse_www_authenticate
                            (res,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_78,iVar4 == 0x197);
          if (bVar2) {
            Request::Request((Request *)&req_save.authorization_count_,req);
            req2._552_8_ = req2._552_8_ + 1;
            __s = "Authorization";
            if (iVar4 == 0x197) {
              __s = "Proxy-Authorization";
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&req2.authorization_count_,__s,
                       (allocator<char> *)&new_res.is_chunked_content_provider_);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)((long)&req2.path.field_2 + 8),(key_type *)&req2.authorization_count_);
            std::__cxx11::string::~string((string *)&req2.authorization_count_);
            cnonce_count = req2._552_8_;
            detail::random_string_abi_cxx11_
                      ((string *)&new_res.is_chunked_content_provider_,(detail *)0xa,length);
            cnonce = &new_res.is_chunked_content_provider_;
            detail::make_digest_authentication_header
                      ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&req2.authorization_count_,req,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_78,cnonce_count,(string *)cnonce,
                       (string *)auth._M_t._M_impl.super__Rb_tree_header._M_node_count,password,
                       iVar4 == 0x197);
            iVar4 = (int)cnonce;
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)(req2.path.field_2._M_local_buf + 8),
                       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&req2.authorization_count_);
            Catch::clara::std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&req2.authorization_count_);
            std::__cxx11::string::~string((string *)&new_res.is_chunked_content_provider_);
            req2.authorization_count_ = (size_t)&new_res.version._M_string_length;
            new_res.version._M_dataplus._M_p = (pointer)0x0;
            new_res.version._M_string_length._0_1_ = 0;
            new_res.version.field_2._8_4_ = 0xffffffff;
            new_res._32_8_ = &new_res.reason._M_string_length;
            new_res.reason._M_dataplus._M_p = (pointer)0x0;
            new_res.reason._M_string_length._0_1_ = 0;
            new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)&new_res.headers;
            new_res.headers._M_t._M_impl._0_4_ = 0;
            new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
            new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
            new_res.headers._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 (size_t)&new_res.body._M_string_length;
            new_res.body._M_dataplus._M_p = (pointer)0x0;
            new_res.body._M_string_length._0_1_ = 0;
            new_res.body.field_2._8_8_ = &new_res.location._M_string_length;
            new_res.location._M_dataplus._M_p = (pointer)0x0;
            new_res.location._M_string_length._0_1_ = 0;
            new_res.location.field_2._8_8_ = 0;
            new_res.content_length_ = 0;
            new_res.content_provider_.super__Function_base._M_functor._M_unused._M_object =
                 (void *)0x0;
            new_res.content_provider_.super__Function_base._M_functor._8_8_ = 0;
            new_res.content_provider_.super__Function_base._M_manager = (_Manager_type)0x0;
            new_res.content_provider_._M_invoker = (_Invoker_type)0x0;
            new_res.content_provider_resource_releaser_.super__Function_base._M_functor._M_unused.
            _M_object = (void *)0x0;
            new_res.content_provider_resource_releaser_.super__Function_base._M_functor._8_2_ = 0;
            new_res.content_provider_resource_releaser_.super__Function_base._M_functor._10_6_ = 0;
            new_res.content_provider_resource_releaser_.super__Function_base._M_manager._0_2_ = 0;
            new_res.content_provider_resource_releaser_._18_8_ = 0;
            new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            sVar5 = send(this,(int)&req_save.authorization_count_,&req2.authorization_count_,
                         (size_t)error,iVar4);
            cVar3 = (char)sVar5;
            if (cVar3 != '\0') {
              Response::operator=(res,(Response *)&req2.authorization_count_);
            }
            Response::~Response((Response *)&req2.authorization_count_);
            Request::~Request((Request *)&req_save.authorization_count_);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_78);
        }
      }
    }
    else {
      cVar3 = '\0';
    }
    Request::~Request((Request *)local_610);
    return (bool)cVar3;
  }
  *error = Connection;
  return false;
}

Assistant:

inline bool ClientImpl::handle_request(Stream& strm, Request& req,
        Response& res, bool close_connection,
        Error& error) {
        if (req.path.empty()) {
            error = Error::Connection;
            return false;
        }

        auto req_save = req;

        bool ret;

        if (!is_ssl() && !proxy_host_.empty() && proxy_port_ != -1) {
            auto req2 = req;
            req2.path = "http://" + host_and_port_ + req.path;
            ret = process_request(strm, req2, res, close_connection, error);
            req = req2;
            req.path = req_save.path;
        } else {
            ret = process_request(strm, req, res, close_connection, error);
        }

        if (!ret) { return false; }

        if (300 < res.status && res.status < 400 && follow_location_) {
            req = req_save;
            ret = redirect(req, res, error);
        }

    #ifdef CPPHTTPLIB_OPENSSL_SUPPORT
        if ((res.status == 401 || res.status == 407) &&
            req.authorization_count_ < 5) {
            auto is_proxy = res.status == 407;
            const auto& username =
                is_proxy ? proxy_digest_auth_username_ : digest_auth_username_;
            const auto& password =
                is_proxy ? proxy_digest_auth_password_ : digest_auth_password_;

            if (!username.empty() && !password.empty()) {
                std::map<std::string, std::string> auth;
                if (detail::parse_www_authenticate(res, auth, is_proxy)) {
                    Request new_req = req;
                    new_req.authorization_count_ += 1;
                    new_req.headers.erase(is_proxy ? "Proxy-Authorization"
                        : "Authorization");
                    new_req.headers.insert(detail::make_digest_authentication_header(
                        req, auth, new_req.authorization_count_, detail::random_string(10),
                        username, password, is_proxy));

                    Response new_res;

                    ret = send(new_req, new_res, error);
                    if (ret) { res = new_res; }
                }
            }
        }
    #endif

        return ret;
    }